

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int check_ihdr(spng_ihdr *ihdr,uint32_t max_width,uint32_t max_height)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  if ((int)ihdr->width < 1) {
    return 5;
  }
  if ((int)ihdr->height < 1) {
    return 6;
  }
  if (max_width < ihdr->width) {
    return 7;
  }
  if (max_height < ihdr->height) {
    return 8;
  }
  iVar2 = 10;
  switch(ihdr->color_type) {
  case '\0':
    bVar1 = ihdr->bit_depth;
    if (0x10 < bVar1) {
      return 9;
    }
    uVar3 = 0x10116;
    break;
  default:
    goto switchD_00108b5b_caseD_1;
  case '\x02':
  case '\x04':
  case '\x06':
    if ((ihdr->bit_depth != '\b') && (ihdr->bit_depth != '\x10')) {
      return 9;
    }
    goto LAB_00108b98;
  case '\x03':
    bVar1 = ihdr->bit_depth;
    if (8 < bVar1) {
      return 9;
    }
    uVar3 = 0x116;
  }
  iVar2 = 9;
  if ((uVar3 >> (bVar1 & 0x1f) & 1) != 0) {
LAB_00108b98:
    if (ihdr->compression_method == '\0') {
      if (ihdr->filter_method == '\0') {
        if (1 < ihdr->interlace_method) {
          return 0xd;
        }
        return 0;
      }
      iVar2 = 0xc;
    }
    else {
      iVar2 = 0xb;
    }
    return iVar2;
  }
switchD_00108b5b_caseD_1:
  return iVar2;
}

Assistant:

static int check_ihdr(const struct spng_ihdr *ihdr, uint32_t max_width, uint32_t max_height)
{
    if(ihdr->width > spng_u32max || !ihdr->width) return SPNG_EWIDTH;
    if(ihdr->height > spng_u32max || !ihdr->height) return SPNG_EHEIGHT;

    if(ihdr->width > max_width) return SPNG_EUSER_WIDTH;
    if(ihdr->height > max_height) return SPNG_EUSER_HEIGHT;

    switch(ihdr->color_type)
    {
        case SPNG_COLOR_TYPE_GRAYSCALE:
        {
            if( !(ihdr->bit_depth == 1 || ihdr->bit_depth == 2 ||
                  ihdr->bit_depth == 4 || ihdr->bit_depth == 8 ||
                  ihdr->bit_depth == 16) )
                  return SPNG_EBIT_DEPTH;

            break;
        }
        case SPNG_COLOR_TYPE_TRUECOLOR:
        case SPNG_COLOR_TYPE_GRAYSCALE_ALPHA:
        case SPNG_COLOR_TYPE_TRUECOLOR_ALPHA:
        {
            if( !(ihdr->bit_depth == 8 || ihdr->bit_depth == 16) )
                return SPNG_EBIT_DEPTH;

            break;
        }
        case SPNG_COLOR_TYPE_INDEXED:
        {
            if( !(ihdr->bit_depth == 1 || ihdr->bit_depth == 2 ||
                  ihdr->bit_depth == 4 || ihdr->bit_depth == 8) )
                return SPNG_EBIT_DEPTH;

            break;
        }
        default: return SPNG_ECOLOR_TYPE;
    }

    if(ihdr->compression_method) return SPNG_ECOMPRESSION_METHOD;
    if(ihdr->filter_method) return SPNG_EFILTER_METHOD;

    if(ihdr->interlace_method > 1) return SPNG_EINTERLACE_METHOD;

    return 0;
}